

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

Generator * __thiscall kratos::Stmt::generator_parent(Stmt *this)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  undefined4 extraout_var;
  Generator *pGVar4;
  uint uVar5;
  bool bVar6;
  IRNode *pIVar3;
  
  pIVar3 = this->parent_;
  bVar6 = pIVar3 != (IRNode *)0x0;
  if ((bVar6) && (pIVar3->ast_node_type_ != GeneratorKind)) {
    uVar5 = 0;
    do {
      iVar2 = (*pIVar3->_vptr_IRNode[4])(pIVar3);
      pIVar3 = (IRNode *)CONCAT44(extraout_var,iVar2);
      bVar6 = pIVar3 != (IRNode *)0x0;
      if ((0x1869e < uVar5) || (pIVar3 == (IRNode *)0x0)) break;
      uVar5 = uVar5 + 1;
    } while (pIVar3->ast_node_type_ != GeneratorKind);
  }
  if ((bVar6) && (pIVar3->ast_node_type_ == GeneratorKind)) {
    pGVar4 = (Generator *)__dynamic_cast(pIVar3,&IRNode::typeinfo,&Generator::typeinfo,0);
    return pGVar4;
  }
  if ((((this->type_ == Block) && (pIVar3 = this->parent_, pIVar3 != (IRNode *)0x0)) &&
      (pIVar3->ast_node_type_ == StmtKind)) &&
     (*(int *)&pIVar3[1].fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == 2)) {
    psVar1 = pIVar3[1].attributes_.
             super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              pIVar3[1].attributes_.
              super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    pGVar4 = (Generator *)
             (*(code *)(psVar1->super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr[1].type_str._M_string_length)();
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    pGVar4 = (Generator *)0x0;
  }
  return pGVar4;
}

Assistant:

Generator *Stmt::generator_parent() const {
    IRNode *p = parent_;
    // we don't do while loop here to prevent infinite loop
    // 100000 is sufficient for almost all designs.
    for (uint32_t i = 0; i < 100000u && p; i++) {
        if (p->ir_node_kind() != IRNodeKind::GeneratorKind) {
            p = p->parent();
        } else {
            break;
        }
    }
    if (!p || p->ir_node_kind() != IRNodeKind::GeneratorKind) {
        // special case for nested for loop
        if (type() == StatementType::Block && parent_ &&
            parent_->ir_node_kind() == IRNodeKind::StmtKind &&
            reinterpret_cast<Stmt *>(parent_)->type() == StatementType::For) {
            // take the best shot
            auto *for_ = reinterpret_cast<ForStmt *>(parent_);
            return for_->get_iter_var()->generator();
        }
        return nullptr;
    }
    return dynamic_cast<Generator *>(p);
}